

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,TouchPoint *p)

{
  undefined8 uVar1;
  QDebug QVar2;
  qreal qVar3;
  int *in_RDX;
  QTextStream *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  undefined1 local_80 [8];
  QDebug local_78;
  QPointF local_70;
  QDebug local_60;
  QDebug local_58;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)p);
  pQVar4 = *(QTextStream **)p;
  pQVar4[0x30] = (QTextStream)0x0;
  QVar5.m_data = (storage_type *)0xb;
  QVar5.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar4 = *(QTextStream **)p;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = *(QTextStream **)p;
  }
  QTextStream::operator<<(pQVar4,*in_RDX);
  pQVar4 = *(QTextStream **)p;
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = *(QTextStream **)p;
  }
  QVar6.m_data = (storage_type *)0x2;
  QVar6.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  local_80 = *(undefined1 (*) [8])p;
  if (((Stream *)local_80)->space == true) {
    QTextStream::operator<<((QTextStream *)local_80,' ');
    local_80 = *(undefined1 (*) [8])p;
  }
  ((Stream *)local_80)->ref = ((Stream *)local_80)->ref + 1;
  operator<<((QDebug *)(local_80 + 8),(QRectF *)local_80);
  QVar2.stream = local_78.stream;
  QVar7.m_data = &DAT_0000000c;
  QVar7.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<(&(QVar2.stream)->ts,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (*(QTextStream *)((long)local_78.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<(&(local_78.stream)->ts,' ');
  }
  *(int *)((long)local_78.stream + 0x28) = *(int *)((long)local_78.stream + 0x28) + 1;
  operator<<((QDebug *)&local_70.yp,(QPointF *)(local_80 + 0x10));
  qVar3 = local_70.yp;
  QVar8.m_data = (storage_type *)0x7;
  QVar8.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)qVar3,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (*(QTextStream *)((long)local_70.yp + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_70.yp,' ');
  }
  QTextStream::operator<<((QTextStream *)local_70.yp,*(double *)(in_RDX + 0x10));
  if (*(QTextStream *)((long)local_70.yp + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_70.yp,' ');
  }
  qVar3 = local_70.yp;
  QVar9.m_data = &DAT_00000005;
  QVar9.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<((QTextStream *)qVar3,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (*(QTextStream *)((long)local_70.yp + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_70.yp,' ');
  }
  *(int *)((long)local_70.yp + 0x28) = *(int *)((long)local_70.yp + 0x28) + 1;
  operator<<((Stream *)&local_58,(QVector2D)*(float (*) [2])(in_RDX + 0x15));
  QVar2.stream = local_58.stream;
  QVar10.m_data = (storage_type *)0x7;
  QVar10.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(&(QVar2.stream)->ts,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if ((local_58.stream)->space == true) {
    QTextStream::operator<<(&(local_58.stream)->ts,' ');
  }
  QTextStream::operator<<(&(local_58.stream)->ts,(uint)*(byte *)(in_RDX + 0x14));
  if ((local_58.stream)->space == true) {
    QTextStream::operator<<(&(local_58.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  QDebug::~QDebug((QDebug *)&local_70.yp);
  QDebug::~QDebug((QDebug *)(local_80 + 0x10));
  QDebug::~QDebug((QDebug *)(local_80 + 8));
  QDebug::~QDebug((QDebug *)local_80);
  uVar1 = *(undefined8 *)p;
  *(undefined8 *)p = 0;
  *(undefined8 *)dbg.stream = uVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug dbg, const QWindowSystemInterface::TouchPoint &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "TouchPoint(" << p.id << " @" << p.area << " normalized " << p.normalPosition
                  << " press " << p.pressure << " vel " << p.velocity << " state " << (int)p.state;
    return dbg;
}